

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

bool Recognition::is_real(string *str)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  invalid_argument *this;
  char *local_30;
  
  __nptr = (str->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  strtod(__nptr,&local_30);
  if (local_30 == __nptr) {
    std::__throw_invalid_argument("stod");
  }
  else if (*piVar2 != 0x22) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (str->_M_string_length <= (ulong)((long)local_30 - (long)__nptr)) {
      return true;
    }
    goto LAB_00120303;
  }
  std::__throw_out_of_range("stod");
LAB_00120303:
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"invalid real argument");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static bool is_real(const std::string &str) {
        try {
            std::string::size_type pos;
            std::stod(str, &pos);
            if (pos < str.length()) {
                throw std::invalid_argument("invalid real argument");
            }
            return true;
        } catch (const std::invalid_argument &e) {
            return false;
        } catch (const std::out_of_range &e) {
            return false;
        }
    }